

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise::forward(ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob)

{
  uint uVar1;
  int *piVar2;
  int k;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  void *pvVar10;
  void *pvVar11;
  int iVar12;
  void *pvVar13;
  ulong uVar14;
  uint uVar15;
  size_type __n;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  size_t sVar23;
  bool bVar24;
  float fVar25;
  undefined1 auVar26 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_140;
  void *local_138;
  allocator_type local_121;
  void *local_120;
  void *local_118;
  ulong local_110;
  Mat local_108;
  void *local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  void *local_b0;
  long local_a8;
  void *local_a0;
  ulong local_98;
  int local_8c;
  ulong local_88;
  ulong local_80;
  long local_78;
  void *local_70;
  long local_68;
  void *local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_108.c = bottom_blob->c;
  pvVar13 = (void *)(ulong)(uint)local_108.c;
  if (local_108.c % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar7 = bottom_blob->w;
  iVar16 = bottom_blob->h;
  uVar22 = (this->kernel_w + -1) * this->dilation_w;
  uVar15 = (this->kernel_h + -1) * this->dilation_h;
  local_108.data = bottom_blob->data;
  local_108.refcount = bottom_blob->refcount;
  local_108.elemsize = bottom_blob->elemsize;
  local_108.dims = bottom_blob->dims;
  local_108.h = iVar16;
  local_108.w = iVar7;
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + 1;
    UNLOCK();
    local_108.w = bottom_blob->w;
    local_108.h = bottom_blob->h;
    local_108.c = bottom_blob->c;
  }
  local_108.cstep = bottom_blob->cstep;
  iVar3 = this->pad_w;
  iVar18 = this->pad_h;
  if (iVar18 < 1 && iVar3 < 1) {
    if (iVar18 == -0xe9 && iVar3 == -0xe9) {
      iVar18 = uVar22 - (iVar7 + -1) % this->stride_w;
      iVar3 = uVar15 - (iVar16 + -1) % this->stride_h;
      if ((0 < iVar18) || (iVar16 = local_108.h, iVar7 = local_108.w, 0 < iVar3)) {
        copy_make_border(bottom_blob,&local_108,iVar3 / 2,iVar3 - iVar3 / 2,iVar18 / 2,
                         iVar18 - iVar18 / 2,0,0.0);
        goto LAB_00132ac6;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,&local_108,iVar18,iVar18,iVar3,iVar3,0,0.0);
LAB_00132ac6:
    iVar3 = -100;
    if ((local_108.data == (void *)0x0) ||
       (iVar16 = local_108.h, iVar7 = local_108.w, (long)local_108.c * local_108.cstep == 0))
    goto LAB_0013328b;
  }
  uVar19 = (long)(int)(~uVar22 + iVar7) / (long)this->stride_w;
  local_80 = uVar19 & 0xffffffff;
  uVar21 = (long)(int)(~uVar15 + iVar16) / (long)this->stride_h;
  local_b8 = uVar21 & 0xffffffff;
  uVar22 = (int)uVar19 + 1;
  uVar15 = (int)uVar21 + 1;
  iVar16 = this->num_output;
  auVar26._0_4_ = -(uint)(top_blob->dims == 3);
  auVar26._4_4_ = -(uint)(uVar22 == top_blob->w);
  auVar26._8_4_ = -(uint)(uVar15 == top_blob->h);
  auVar26._12_4_ = -(uint)(iVar16 == top_blob->c);
  iVar3 = movmskps(3,auVar26);
  if ((iVar3 == 0xf) && (top_blob->elemsize == 4)) {
    if (top_blob->data != (void *)0x0) {
      sVar23 = top_blob->cstep;
LAB_00132ca9:
      if ((long)iVar16 * sVar23 != 0) {
        uVar20 = this->kernel_w * this->kernel_h;
        __n = (size_type)(int)uVar20;
        local_120 = pvVar13;
        std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_121);
        iVar16 = this->kernel_h;
        if (0 < iVar16) {
          iVar3 = this->dilation_h;
          iVar18 = this->kernel_w;
          iVar4 = this->dilation_w * iVar18;
          iVar5 = 0;
          iVar9 = 0;
          iVar12 = 0;
          do {
            if (0 < iVar18) {
              lVar17 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar5 + lVar17] = iVar9;
                iVar9 = iVar9 + this->dilation_w;
                iVar18 = this->kernel_w;
                lVar17 = lVar17 + 1;
              } while ((int)lVar17 < iVar18);
              iVar5 = iVar5 + (int)lVar17;
              iVar16 = this->kernel_h;
            }
            iVar9 = iVar9 + (iVar7 * iVar3 - iVar4);
            iVar12 = iVar12 + 1;
          } while (iVar12 < iVar16);
        }
        uVar1 = this->group;
        uVar6 = (uint)local_120;
        if (uVar1 == this->num_output && uVar6 == uVar1) {
          if (0 < (int)uVar6) {
            local_b0 = top_blob->data;
            local_110 = top_blob->cstep * top_blob->elemsize;
            pvVar13 = (this->weight_data).data;
            local_c0 = CONCAT44(local_c0._4_4_,local_108.w);
            local_118 = local_108.data;
            local_d8 = (void *)(local_108.cstep * local_108.elemsize);
            local_98 = (ulong)(int)uVar22;
            local_a0 = (void *)(ulong)uVar15;
            local_138 = (void *)0x0;
            do {
              if (-1 < (int)local_b8) {
                pvVar11 = (void *)(local_110 * (long)local_138 + (long)local_b0);
                iVar7 = this->bias_term;
                iVar3 = this->stride_h * local_108.w;
                local_a8 = CONCAT44(local_a8._4_4_,iVar3);
                iVar16 = this->stride_w;
                local_140 = (void *)0x0;
                do {
                  if (-1 < (int)local_80) {
                    pvVar10 = (this->bias_data).data;
                    uVar19 = 0;
                    do {
                      if (iVar7 == 0) {
                        fVar25 = 0.0;
                      }
                      else {
                        fVar25 = *(float *)((long)pvVar10 + (long)local_138 * 4);
                      }
                      if (0 < (int)uVar20) {
                        uVar21 = 0;
                        do {
                          fVar25 = fVar25 + *(float *)((long)pvVar13 + uVar21 * 4) *
                                            *(float *)((long)local_108.data +
                                                      (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar21] *
                                                  4 + uVar19 * (long)iVar16 * 4 +
                                                      (long)(iVar3 * (int)local_140) * 4 +
                                                      (long)local_d8 * (long)local_138);
                          uVar21 = uVar21 + 1;
                        } while (uVar20 != uVar21);
                      }
                      *(float *)((long)pvVar11 + uVar19 * 4) = fVar25;
                      uVar19 = uVar19 + 1;
                    } while (uVar19 != uVar22);
                  }
                  pvVar11 = (void *)((long)pvVar11 + local_98 * 4);
                  local_140 = (void *)((long)local_140 + 1);
                } while (local_140 != local_a0);
              }
              local_138 = (void *)((long)local_138 + 1);
              pvVar13 = (void *)((long)pvVar13 + __n * 4);
            } while (local_138 != local_120);
          }
        }
        else {
          local_88 = (ulong)uVar1;
          uVar19 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | (ulong)local_120 & 0xffffffff)
                   / (long)(int)uVar1;
          iVar7 = (int)uVar19;
          if (0 < (int)uVar1) {
            uVar21 = (long)this->num_output / (long)(int)uVar1;
            local_d8 = (void *)(uVar21 & 0xffffffff);
            local_60 = top_blob->data;
            local_68 = top_blob->cstep * top_blob->elemsize;
            local_70 = (this->weight_data).data;
            local_c0 = (long)(int)uVar22;
            iVar16 = (int)uVar21;
            local_78 = (long)iVar16;
            local_98 = (ulong)uVar22;
            local_8c = iVar16 * iVar7 * uVar20;
            local_50 = (long)(int)(iVar7 * uVar20) * 4;
            local_c8 = 0;
            local_d0 = 0;
            do {
              if (0 < iVar16) {
                local_120 = (void *)((long)local_70 + (long)(int)local_c8 * 4);
                local_58 = local_d0 * local_78;
                local_118 = (void *)0x0;
                do {
                  if (-1 < (int)local_b8) {
                    local_b0 = (void *)((long)local_118 + local_58);
                    pvVar13 = (void *)(local_68 * (long)local_b0 + (long)local_60);
                    iVar3 = this->bias_term;
                    local_110 = 0;
                    do {
                      if (-1 < (int)local_80) {
                        local_a0 = (this->bias_data).data;
                        iVar18 = this->stride_h;
                        local_a8 = (long)this->stride_w;
                        uVar21 = 0;
                        do {
                          if (iVar3 == 0) {
                            fVar25 = 0.0;
                          }
                          else {
                            fVar25 = *(float *)((long)local_a0 + (long)local_b0 * 4);
                          }
                          if (0 < iVar7) {
                            uVar14 = 0;
                            pvVar11 = local_120;
                            do {
                              if (0 < (int)uVar20) {
                                uVar8 = 0;
                                do {
                                  fVar25 = fVar25 + *(float *)((long)pvVar11 + uVar8 * 4) *
                                                    *(float *)((long)local_108.data +
                                                              (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar8] *
                                                  4 + (uVar14 + (uint)(iVar7 * (int)local_d0)) *
                                                      local_108.cstep * local_108.elemsize +
                                                      uVar21 * local_a8 * 4 +
                                                      (long)(local_108.w * (int)local_110 * iVar18)
                                                      * 4);
                                  uVar8 = uVar8 + 1;
                                } while (uVar20 != uVar8);
                              }
                              uVar14 = uVar14 + 1;
                              pvVar11 = (void *)((long)pvVar11 + __n * 4);
                            } while (uVar14 != (uVar19 & 0xffffffff));
                          }
                          *(float *)((long)pvVar13 + uVar21 * 4) = fVar25;
                          uVar21 = uVar21 + 1;
                        } while (uVar21 != local_98);
                      }
                      pvVar13 = (void *)((long)pvVar13 + local_c0 * 4);
                      uVar15 = (int)local_110 + 1;
                      bVar24 = (int)local_110 != (int)local_b8;
                      local_110 = (ulong)uVar15;
                    } while (bVar24);
                  }
                  local_118 = (void *)((long)local_118 + 1);
                  local_120 = (void *)((long)local_120 + local_50);
                } while (local_118 != local_d8);
              }
              local_d0 = local_d0 + 1;
              local_c8 = (ulong)(uint)((int)local_c8 + local_8c);
            } while (local_d0 != local_88);
          }
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar3 = 0;
        goto LAB_0013328b;
      }
    }
  }
  else {
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = uVar22;
    top_blob->h = uVar15;
    top_blob->c = iVar16;
    sVar23 = (long)(int)(uVar15 * uVar22) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = sVar23;
    lVar17 = (long)iVar16 * sVar23;
    if (lVar17 != 0) {
      pvVar11 = malloc(lVar17 * 4 + 0x1c);
      pvVar10 = (void *)((long)pvVar11 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar10 - 8) = pvVar11;
      top_blob->data = pvVar10;
      piVar2 = (int *)((long)pvVar10 + lVar17 * 4);
      top_blob->refcount = piVar2;
      *piVar2 = 1;
      iVar16 = top_blob->c;
      goto LAB_00132ca9;
    }
  }
  iVar3 = -100;
LAB_0013328b:
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + -1;
    UNLOCK();
    if ((*local_108.refcount == 0) && (local_108.data != (void *)0x0)) {
      free(*(void **)((long)local_108.data + -8));
    }
  }
  return iVar3;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

#ifdef _WIN32
    #pragma omp parallel for
#else // _WIN32
    #pragma omp parallel for collapse(2)
#endif // _WIN32
    for (int g=0; g<group; g++)
    {
        for (int p=0; p<num_output_g; p++)
        {
            float* outptr = top_blob.channel(g * num_output_g + p);
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[num_output_g * g + p];

                    const float* kptr = weight_data_ptr + maxk * channels_g * p;

                    // channels_g
                    for (int q=0; q<channels_g; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }

    return 0;
}